

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O3

void Eigen::internal::
     general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<double,_long,_1> *alhs,
          const_blas_data_mapper<double,_long,_0> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  double *pdVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double *local_f0;
  double *local_e8;
  double *local_a0;
  double *local_98;
  
  pdVar12 = (alhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_data;
  lVar2 = (alhs->super_blas_data_mapper<const_double,_long,_1,_0,_1>).m_stride;
  if (rows < 8 || 32000 < (ulong)(lVar2 * 8)) {
    uVar13 = 0;
  }
  else {
    pdVar8 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data;
    pdVar9 = pdVar12 + lVar2 * 7;
    pdVar14 = pdVar12 + lVar2 * 3;
    pdVar10 = pdVar12 + lVar2 * 6;
    local_e8 = pdVar12 + lVar2 * 5;
    local_f0 = pdVar12 + lVar2 * 4;
    local_98 = pdVar12 + lVar2 * 2;
    local_a0 = pdVar12 + lVar2;
    uVar13 = 0;
    pdVar5 = pdVar12;
    do {
      if (cols < 2) {
        dVar23 = 0.0;
        dVar24 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar25 = 0.0;
        dVar26 = 0.0;
        dVar17 = 0.0;
        dVar18 = 0.0;
        dVar27 = 0.0;
        dVar28 = 0.0;
        dVar19 = 0.0;
        dVar20 = 0.0;
        dVar29 = 0.0;
        dVar30 = 0.0;
        dVar21 = 0.0;
        dVar22 = 0.0;
        lVar11 = 0;
      }
      else {
        dVar21 = 0.0;
        dVar22 = 0.0;
        dVar29 = 0.0;
        dVar30 = 0.0;
        dVar19 = 0.0;
        dVar20 = 0.0;
        dVar27 = 0.0;
        dVar28 = 0.0;
        dVar17 = 0.0;
        dVar18 = 0.0;
        dVar25 = 0.0;
        dVar26 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar23 = 0.0;
        dVar24 = 0.0;
        lVar7 = 0;
        do {
          pdVar1 = pdVar8 + lVar7;
          dVar3 = *pdVar1;
          dVar4 = pdVar1[1];
          dVar21 = dVar21 + pdVar5[lVar7] * dVar3;
          dVar22 = dVar22 + (pdVar5 + lVar7)[1] * dVar4;
          dVar29 = dVar29 + pdVar5[lVar7 + lVar2] * dVar3;
          dVar30 = dVar30 + (pdVar5 + lVar7 + lVar2)[1] * dVar4;
          dVar19 = dVar19 + pdVar5[lVar7 + lVar2 * 2] * dVar3;
          dVar20 = dVar20 + (pdVar5 + lVar7 + lVar2 * 2)[1] * dVar4;
          dVar27 = dVar27 + pdVar5[lVar7 + lVar2 * 3] * dVar3;
          dVar28 = dVar28 + (pdVar5 + lVar7 + lVar2 * 3)[1] * dVar4;
          dVar17 = dVar17 + pdVar5[lVar7 + lVar2 * 4] * dVar3;
          dVar18 = dVar18 + (pdVar5 + lVar7 + lVar2 * 4)[1] * dVar4;
          dVar25 = dVar25 + pdVar5[lVar7 + lVar2 * 5] * dVar3;
          dVar26 = dVar26 + (pdVar5 + lVar7 + lVar2 * 5)[1] * dVar4;
          dVar15 = dVar15 + pdVar5[lVar7 + lVar2 * 6] * dVar3;
          dVar16 = dVar16 + (pdVar5 + lVar7 + lVar2 * 6)[1] * dVar4;
          dVar23 = dVar23 + pdVar5[lVar7 + lVar2 * 7] * dVar3;
          dVar24 = dVar24 + (pdVar5 + lVar7 + lVar2 * 7)[1] * dVar4;
          lVar11 = lVar7 + 2;
          lVar6 = lVar7 + 4;
          lVar7 = lVar11;
        } while (lVar6 <= cols);
      }
      dVar22 = dVar22 + dVar21;
      dVar30 = dVar30 + dVar29;
      dVar20 = dVar20 + dVar19;
      dVar28 = dVar28 + dVar27;
      dVar18 = dVar18 + dVar17;
      dVar26 = dVar26 + dVar25;
      dVar16 = dVar16 + dVar15;
      dVar24 = dVar24 + dVar23;
      if (lVar11 < cols) {
        lVar7 = 0;
        do {
          dVar15 = pdVar8[lVar11 + lVar7];
          dVar22 = dVar22 + pdVar5[lVar11 + lVar7] * dVar15;
          dVar30 = dVar30 + local_a0[lVar11 + lVar7] * dVar15;
          dVar20 = dVar20 + local_98[lVar11 + lVar7] * dVar15;
          dVar28 = dVar28 + pdVar14[lVar11 + lVar7] * dVar15;
          dVar18 = dVar18 + local_f0[lVar11 + lVar7] * dVar15;
          dVar26 = dVar26 + local_e8[lVar11 + lVar7] * dVar15;
          dVar16 = dVar16 + pdVar10[lVar11 + lVar7] * dVar15;
          dVar24 = dVar24 + pdVar9[lVar11 + lVar7] * dVar15;
          lVar7 = lVar7 + 1;
        } while (cols - lVar11 != lVar7);
      }
      res[uVar13 * resIncr] = alpha * dVar22 + res[uVar13 * resIncr];
      lVar7 = (uVar13 | 1) * resIncr;
      res[lVar7] = dVar30 * alpha + res[lVar7];
      lVar7 = (uVar13 | 2) * resIncr;
      res[lVar7] = alpha * dVar20 + res[lVar7];
      lVar7 = (uVar13 | 3) * resIncr;
      res[lVar7] = dVar28 * alpha + res[lVar7];
      lVar7 = (uVar13 | 4) * resIncr;
      res[lVar7] = alpha * dVar18 + res[lVar7];
      lVar7 = (uVar13 | 5) * resIncr;
      res[lVar7] = dVar26 * alpha + res[lVar7];
      lVar7 = (uVar13 | 6) * resIncr;
      res[lVar7] = alpha * dVar16 + res[lVar7];
      lVar7 = (uVar13 | 7) * resIncr;
      res[lVar7] = dVar24 * alpha + res[lVar7];
      uVar13 = uVar13 + 8;
      pdVar5 = pdVar5 + lVar2 * 8;
      pdVar9 = pdVar9 + lVar2 * 8;
      pdVar10 = pdVar10 + lVar2 * 8;
      local_e8 = local_e8 + lVar2 * 8;
      local_f0 = local_f0 + lVar2 * 8;
      pdVar14 = pdVar14 + lVar2 * 8;
      local_98 = local_98 + lVar2 * 8;
      local_a0 = local_a0 + lVar2 * 8;
    } while ((long)uVar13 < rows + -7);
  }
  if ((long)uVar13 < rows + -3) {
    pdVar10 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data;
    pdVar14 = pdVar12 + (uVar13 + 3) * lVar2;
    pdVar8 = pdVar12 + (uVar13 + 2) * lVar2;
    pdVar5 = pdVar12 + (uVar13 + 1) * lVar2;
    pdVar9 = pdVar12 + uVar13 * lVar2;
    do {
      if (cols < 2) {
        dVar19 = 0.0;
        dVar24 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar20 = 0.0;
        dVar26 = 0.0;
        dVar17 = 0.0;
        dVar18 = 0.0;
        lVar11 = 0;
      }
      else {
        dVar17 = 0.0;
        dVar18 = 0.0;
        dVar20 = 0.0;
        dVar26 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar19 = 0.0;
        dVar24 = 0.0;
        lVar7 = 0;
        do {
          pdVar1 = pdVar10 + lVar7;
          dVar28 = *pdVar1;
          dVar21 = pdVar1[1];
          dVar17 = dVar17 + pdVar9[lVar7] * dVar28;
          dVar18 = dVar18 + (pdVar9 + lVar7)[1] * dVar21;
          dVar20 = dVar20 + pdVar5[lVar7] * dVar28;
          dVar26 = dVar26 + (pdVar5 + lVar7)[1] * dVar21;
          dVar15 = dVar15 + pdVar8[lVar7] * dVar28;
          dVar16 = dVar16 + (pdVar8 + lVar7)[1] * dVar21;
          dVar19 = dVar19 + pdVar14[lVar7] * dVar28;
          dVar24 = dVar24 + (pdVar14 + lVar7)[1] * dVar21;
          lVar11 = lVar7 + 2;
          lVar6 = lVar7 + 4;
          lVar7 = lVar11;
        } while (lVar6 <= cols);
      }
      dVar18 = dVar18 + dVar17;
      dVar26 = dVar26 + dVar20;
      dVar16 = dVar16 + dVar15;
      dVar24 = dVar24 + dVar19;
      if (lVar11 < cols) {
        lVar7 = 0;
        do {
          dVar15 = pdVar10[lVar11 + lVar7];
          dVar18 = dVar18 + pdVar9[lVar11 + lVar7] * dVar15;
          dVar26 = dVar26 + pdVar5[lVar11 + lVar7] * dVar15;
          dVar16 = dVar16 + pdVar8[lVar11 + lVar7] * dVar15;
          dVar24 = dVar24 + pdVar14[lVar11 + lVar7] * dVar15;
          lVar7 = lVar7 + 1;
        } while (cols - lVar11 != lVar7);
      }
      res[uVar13 * resIncr] = alpha * dVar18 + res[uVar13 * resIncr];
      lVar7 = (uVar13 + 1) * resIncr;
      res[lVar7] = dVar26 * alpha + res[lVar7];
      lVar7 = (uVar13 + 2) * resIncr;
      res[lVar7] = alpha * dVar16 + res[lVar7];
      lVar7 = (uVar13 + 3) * resIncr;
      res[lVar7] = dVar24 * alpha + res[lVar7];
      uVar13 = uVar13 + 4;
      pdVar14 = pdVar14 + lVar2 * 4;
      pdVar8 = pdVar8 + lVar2 * 4;
      pdVar5 = pdVar5 + lVar2 * 4;
      pdVar9 = pdVar9 + lVar2 * 4;
    } while ((long)uVar13 < rows + -3);
  }
  if ((long)uVar13 < rows + -1) {
    pdVar5 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data;
    pdVar14 = pdVar12 + (uVar13 + 1) * lVar2;
    pdVar8 = pdVar12 + uVar13 * lVar2;
    do {
      if (cols < 2) {
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar17 = 0.0;
        dVar24 = 0.0;
        lVar11 = 0;
      }
      else {
        dVar17 = 0.0;
        dVar24 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        lVar7 = 0;
        do {
          pdVar9 = pdVar5 + lVar7;
          dVar18 = *pdVar9;
          dVar26 = pdVar9[1];
          dVar15 = dVar15 + pdVar8[lVar7] * dVar18;
          dVar16 = dVar16 + (pdVar8 + lVar7)[1] * dVar26;
          dVar17 = dVar17 + pdVar14[lVar7] * dVar18;
          dVar24 = dVar24 + (pdVar14 + lVar7)[1] * dVar26;
          lVar11 = lVar7 + 2;
          lVar6 = lVar7 + 4;
          lVar7 = lVar11;
        } while (lVar6 <= cols);
      }
      dVar16 = dVar16 + dVar15;
      dVar24 = dVar24 + dVar17;
      if (lVar11 < cols) {
        do {
          dVar15 = pdVar5[lVar11];
          dVar16 = dVar16 + pdVar8[lVar11] * dVar15;
          dVar24 = dVar24 + pdVar14[lVar11] * dVar15;
          lVar11 = lVar11 + 1;
        } while (cols != lVar11);
      }
      res[uVar13 * resIncr] = alpha * dVar16 + res[uVar13 * resIncr];
      lVar7 = (uVar13 + 1) * resIncr;
      res[lVar7] = dVar24 * alpha + res[lVar7];
      uVar13 = uVar13 + 2;
      pdVar14 = pdVar14 + lVar2 * 2;
      pdVar8 = pdVar8 + lVar2 * 2;
    } while ((long)uVar13 < rows + -1);
  }
  if ((long)uVar13 < rows) {
    pdVar14 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0,_1>).m_data;
    pdVar12 = pdVar12 + lVar2 * uVar13;
    do {
      dVar16 = 0.0;
      dVar15 = 0.0;
      if (cols < 2) {
        lVar11 = 0;
      }
      else {
        lVar7 = 0;
        do {
          pdVar8 = pdVar14 + lVar7;
          dVar16 = dVar16 + pdVar12[lVar7] * *pdVar8;
          dVar15 = dVar15 + (pdVar12 + lVar7)[1] * pdVar8[1];
          lVar11 = lVar7 + 2;
          lVar6 = lVar7 + 4;
          lVar7 = lVar11;
        } while (lVar6 <= cols);
      }
      dVar15 = dVar15 + dVar16;
      if (lVar11 < cols) {
        do {
          dVar15 = dVar15 + pdVar12[lVar11] * pdVar14[lVar11];
          lVar11 = lVar11 + 1;
        } while (cols != lVar11);
      }
      res[uVar13 * resIncr] = dVar15 * alpha + res[uVar13 * resIncr];
      uVar13 = uVar13 + 1;
      pdVar12 = pdVar12 + lVar2;
    } while (uVar13 != rows);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  eigen_internal_assert(rhs.stride()==1);
  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  // TODO: fine tune the following heuristic. The rationale is that if the matrix is very large,
  //       processing 8 rows at once might be counter productive wrt cache.
  const Index n8 = lhs.stride()*sizeof(LhsScalar)>32000 ? 0 : rows-7;
  const Index n4 = rows-3;
  const Index n2 = rows-1;

  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         LhsPacketSizeHalf = HalfTraits::LhsPacketSize,
         LhsPacketSizeQuarter = QuarterTraits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  Index i=0;
  for(; i<n8; i+=8)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0)),
              c4 = pset1<ResPacket>(ResScalar(0)),
              c5 = pset1<ResPacket>(ResScalar(0)),
              c6 = pset1<ResPacket>(ResScalar(0)),
              c7 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
      c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+4,j),b0,c4);
      c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+5,j),b0,c5);
      c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+6,j),b0,c6);
      c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+7,j),b0,c7);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    ResScalar cc4 = predux(c4);
    ResScalar cc5 = predux(c5);
    ResScalar cc6 = predux(c6);
    ResScalar cc7 = predux(c7);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
      cc4 += cj.pmul(lhs(i+4,j), b0);
      cc5 += cj.pmul(lhs(i+5,j), b0);
      cc6 += cj.pmul(lhs(i+6,j), b0);
      cc7 += cj.pmul(lhs(i+7,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
    res[(i+4)*resIncr] += alpha*cc4;
    res[(i+5)*resIncr] += alpha*cc5;
    res[(i+6)*resIncr] += alpha*cc6;
    res[(i+7)*resIncr] += alpha*cc7;
  }
  for(; i<n4; i+=4)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
  }
  for(; i<n2; i+=2)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
  }
  for(; i<rows; ++i)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0));
    ResPacketHalf c0_h = pset1<ResPacketHalf>(ResScalar(0));
    ResPacketQuarter c0_q = pset1<ResPacketQuarter>(ResScalar(0));
    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket,Unaligned>(j,0);
      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i,j),b0,c0);
    }
    ResScalar cc0 = predux(c0);
    if (HasHalf) {
      for(; j+LhsPacketSizeHalf<=cols; j+=LhsPacketSizeHalf)
        {
          RhsPacketHalf b0 = rhs.template load<RhsPacketHalf,Unaligned>(j,0);
          c0_h = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i,j),b0,c0_h);
        }
      cc0 += predux(c0_h);
    }
    if (HasQuarter) {
      for(; j+LhsPacketSizeQuarter<=cols; j+=LhsPacketSizeQuarter)
        {
          RhsPacketQuarter b0 = rhs.template load<RhsPacketQuarter,Unaligned>(j,0);
          c0_q = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i,j),b0,c0_q);
        }
      cc0 += predux(c0_q);
    }
    for(; j<cols; ++j)
    {
      cc0 += cj.pmul(lhs(i,j), rhs(j,0));
    }
    res[i*resIncr] += alpha*cc0;
  }
}